

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

Block * __thiscall
wasm::I64ToI32Lowering::lowerAdd
          (I64ToI32Lowering *this,Block *result,TempVar *leftLow,TempVar *leftHigh,TempVar *rightLow
          ,TempVar *rightHigh)

{
  LocalSet *ifTrue;
  Index IVar1;
  Index IVar2;
  pointer pBVar3;
  pointer pBVar4;
  pointer pBVar5;
  LocalGet *pLVar6;
  LocalGet *pLVar7;
  Binary *pBVar8;
  Const *right;
  Block *e;
  unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_> *puVar9;
  optional<wasm::Type> type;
  Type local_118;
  LocalGet *local_110;
  LocalGet *getLow;
  undefined1 local_100 [12];
  Type local_f0;
  Type local_e8;
  If *local_e0;
  If *checkOverflow;
  LocalSet *local_d0;
  LocalSet *carryBit;
  Type local_c0;
  LocalSet *local_b8;
  LocalSet *addHigh;
  Type local_a8;
  LocalSet *local_a0;
  LocalSet *addLow;
  Type local_88;
  undefined1 local_80 [8];
  TempVar highResult;
  undefined1 local_58 [8];
  TempVar lowResult;
  TempVar *rightHigh_local;
  TempVar *rightLow_local;
  TempVar *leftHigh_local;
  TempVar *leftLow_local;
  Block *result_local;
  I64ToI32Lowering *this_local;
  
  lowResult.ty.id = (uintptr_t)rightHigh;
  wasm::Type::Type(&highResult.ty,i32);
  getTemp((TempVar *)local_58,this,highResult.ty);
  wasm::Type::Type(&local_88,i32);
  getTemp((TempVar *)local_80,this,local_88);
  puVar9 = &this->builder;
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar9);
  IVar1 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_58);
  pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar9);
  pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar9);
  IVar2 = TempVar::operator_cast_to_unsigned_int(leftLow);
  wasm::Type::Type(&local_a8,i32);
  pLVar6 = Builder::makeLocalGet(pBVar5,IVar2,local_a8);
  pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar2 = TempVar::operator_cast_to_unsigned_int(rightLow);
  wasm::Type::Type((Type *)&addHigh,i32);
  pLVar7 = Builder::makeLocalGet(pBVar5,IVar2,(Type)addHigh);
  pBVar8 = Builder::makeBinary(pBVar4,AddInt32,(Expression *)pLVar6,(Expression *)pLVar7);
  local_a0 = Builder::makeLocalSet(pBVar3,IVar1,(Expression *)pBVar8);
  puVar9 = &this->builder;
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar9);
  IVar1 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_80);
  pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar9);
  pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar9);
  IVar2 = TempVar::operator_cast_to_unsigned_int(leftHigh);
  wasm::Type::Type(&local_c0,i32);
  pLVar6 = Builder::makeLocalGet(pBVar5,IVar2,local_c0);
  pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar2 = TempVar::operator_cast_to_unsigned_int((TempVar *)lowResult.ty.id);
  wasm::Type::Type((Type *)&carryBit,i32);
  pLVar7 = Builder::makeLocalGet(pBVar5,IVar2,(Type)carryBit);
  pBVar8 = Builder::makeBinary(pBVar4,AddInt32,(Expression *)pLVar6,(Expression *)pLVar7);
  local_b8 = Builder::makeLocalSet(pBVar3,IVar1,(Expression *)pBVar8);
  puVar9 = &this->builder;
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar9);
  IVar1 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_80);
  pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar9);
  pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar9);
  IVar2 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_80);
  wasm::Type::Type((Type *)&checkOverflow,i32);
  pLVar6 = Builder::makeLocalGet(pBVar5,IVar2,(Type)checkOverflow);
  pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  right = Builder::makeConst<int>(pBVar5,1);
  pBVar8 = Builder::makeBinary(pBVar4,AddInt32,(Expression *)pLVar6,(Expression *)right);
  local_d0 = Builder::makeLocalSet(pBVar3,IVar1,(Expression *)pBVar8);
  puVar9 = &this->builder;
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar9);
  pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar9);
  pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar9);
  IVar1 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_58);
  wasm::Type::Type(&local_e8,i32);
  pLVar6 = Builder::makeLocalGet(pBVar5,IVar1,local_e8);
  pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar1 = TempVar::operator_cast_to_unsigned_int(rightLow);
  wasm::Type::Type(&local_f0,i32);
  pLVar7 = Builder::makeLocalGet(pBVar5,IVar1,local_f0);
  pBVar8 = Builder::makeBinary(pBVar4,LtUInt32,(Expression *)pLVar6,(Expression *)pLVar7);
  ifTrue = local_d0;
  std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_100);
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._12_4_ = 0;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)local_100._0_8_;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_100[8];
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._9_3_ = local_100._9_3_;
  local_e0 = Builder::makeIf(pBVar3,(Expression *)pBVar8,(Expression *)ifTrue,(Expression *)0x0,type
                            );
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar1 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_58);
  wasm::Type::Type(&local_118,i32);
  local_110 = Builder::makeLocalGet(pBVar3,IVar1,local_118);
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  e = Builder::blockify<wasm::LocalSet*,wasm::If*,wasm::LocalGet*>
                (pBVar3,(Expression *)result,(Expression *)local_a0,local_b8,local_e0,local_110);
  setOutParam(this,(Expression *)e,(TempVar *)local_80);
  TempVar::~TempVar((TempVar *)local_80);
  TempVar::~TempVar((TempVar *)local_58);
  return e;
}

Assistant:

Block* lowerAdd(Block* result,
                  TempVar&& leftLow,
                  TempVar&& leftHigh,
                  TempVar&& rightLow,
                  TempVar&& rightHigh) {
    TempVar lowResult = getTemp();
    TempVar highResult = getTemp();
    LocalSet* addLow = builder->makeLocalSet(
      lowResult,
      builder->makeBinary(AddInt32,
                          builder->makeLocalGet(leftLow, Type::i32),
                          builder->makeLocalGet(rightLow, Type::i32)));
    LocalSet* addHigh = builder->makeLocalSet(
      highResult,
      builder->makeBinary(AddInt32,
                          builder->makeLocalGet(leftHigh, Type::i32),
                          builder->makeLocalGet(rightHigh, Type::i32)));
    LocalSet* carryBit = builder->makeLocalSet(
      highResult,
      builder->makeBinary(AddInt32,
                          builder->makeLocalGet(highResult, Type::i32),
                          builder->makeConst(int32_t(1))));
    If* checkOverflow = builder->makeIf(
      builder->makeBinary(LtUInt32,
                          builder->makeLocalGet(lowResult, Type::i32),
                          builder->makeLocalGet(rightLow, Type::i32)),
      carryBit);
    LocalGet* getLow = builder->makeLocalGet(lowResult, Type::i32);
    result = builder->blockify(result, addLow, addHigh, checkOverflow, getLow);
    setOutParam(result, std::move(highResult));
    return result;
  }